

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O2

double * Eigen::internal::conditional_aligned_realloc_new_auto<double,true>
                   (double *pts,size_t new_size,size_t old_size)

{
  double *pdVar1;
  
  if (new_size >> 0x3d != 0) {
    throw_std_bad_alloc();
  }
  if (0x1fffffffffffffff < old_size) {
    throw_std_bad_alloc();
  }
  pdVar1 = (double *)aligned_realloc(pts,new_size << 3,old_size << 3);
  return pdVar1;
}

Assistant:

inline T* conditional_aligned_realloc_new_auto(T* pts, std::size_t new_size, std::size_t old_size)
{
  check_size_for_overflow<T>(new_size);
  check_size_for_overflow<T>(old_size);
  if(NumTraits<T>::RequireInitialization && (new_size < old_size))
    destruct_elements_of_array(pts+new_size, old_size-new_size);
  T *result = reinterpret_cast<T*>(conditional_aligned_realloc<Align>(reinterpret_cast<void*>(pts), sizeof(T)*new_size, sizeof(T)*old_size));
  if(NumTraits<T>::RequireInitialization && (new_size > old_size))
  {
    EIGEN_TRY
    {
      construct_elements_of_array(result+old_size, new_size-old_size);
    }
    EIGEN_CATCH(...)
    {
      conditional_aligned_free<Align>(result);
      EIGEN_THROW;
    }
  }